

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

_view_class gl4cts::TextureViewUtilities::getViewClassForInternalformat(GLenum internalformat)

{
  GLenum GVar1;
  _view_class view_class;
  GLenum array_internalformat;
  int n_entry;
  _view_class result;
  GLenum internalformat_local;
  
  array_internalformat = 0xc;
  view_class = VIEW_CLASS_128_BITS;
  while ((GVar1 = array_internalformat, (int)view_class < 0x3e &&
         (GVar1 = *(GLenum *)
                   (internalformat_view_compatibility_array + (long)(int)(view_class * 2 + 1) * 4),
         *(GLenum *)(internalformat_view_compatibility_array + (long)(int)(view_class << 1) * 4) !=
         internalformat))) {
    view_class = view_class + VIEW_CLASS_96_BITS;
  }
  array_internalformat = GVar1;
  return array_internalformat;
}

Assistant:

_view_class TextureViewUtilities::getViewClassForInternalformat(const glw::GLenum internalformat)
{
	_view_class result = VIEW_CLASS_UNDEFINED;

	/* Note that n_internalformat_view_compatibility_array_entries needs to be divided by 2
	 * because the value refers to a total number of entries in the array, not to the number
	 * of pairs that can be read.
	 */
	for (int n_entry = 0; n_entry < (n_internalformat_view_compatibility_array_entries >> 1); n_entry++)
	{
		glw::GLenum array_internalformat = internalformat_view_compatibility_array[(n_entry * 2) + 0];
		_view_class view_class			 = (_view_class)internalformat_view_compatibility_array[(n_entry * 2) + 1];

		if (array_internalformat == internalformat)
		{
			result = view_class;

			break;
		}
	} /* for (all pairs in data array) */

	return result;
}